

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

unsigned_long
duckdb::TryCastCInternal<double,unsigned_long,duckdb::TryCast>
          (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  unsigned_long in_RAX;
  unsigned_long result_value;
  unsigned_long local_8;
  
  local_8 = in_RAX;
  bVar1 = TryCast::Operation<double,unsigned_long>
                    (*(double *)((long)result->deprecated_columns[col].deprecated_data + row * 8),
                     &local_8,false);
  if (!bVar1) {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}